

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O2

int simplerng_poisson_large(double lambda)

{
  int n;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if ((simplerng_poisson_large::old_lambda != lambda) ||
     (NAN(simplerng_poisson_large::old_lambda) || NAN(lambda))) {
    dVar1 = lambda * 3.0;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    simplerng_poisson_large::beta = 3.141592653589793 / dVar1;
    simplerng_poisson_large::alpha = simplerng_poisson_large::beta * lambda;
    dVar1 = log(-3.36 / lambda + 0.767);
    dVar2 = log(simplerng_poisson_large::beta);
    simplerng_poisson_large::k = (dVar1 - lambda) - dVar2;
    simplerng_poisson_large::old_lambda = lambda;
  }
  do {
    do {
      dVar2 = simplerng_getuniform();
      dVar1 = simplerng_poisson_large::alpha;
      dVar2 = log((1.0 - dVar2) / dVar2);
      dVar2 = (dVar1 - dVar2) / simplerng_poisson_large::beta;
      dVar1 = floor(dVar2 + 0.5);
      n = (int)dVar1;
    } while (n < 0);
    dVar1 = simplerng_getuniform();
    dVar2 = simplerng_poisson_large::alpha - dVar2 * simplerng_poisson_large::beta;
    dVar3 = exp(dVar2);
    dVar3 = log(dVar1 / ((dVar3 + 1.0) * (dVar3 + 1.0)));
    dVar1 = simplerng_poisson_large::k;
    dVar4 = log(lambda);
    dVar5 = simplerng_logfactorial(n);
  } while ((dVar4 * (double)n + dVar1) - dVar5 < dVar3 + dVar2);
  return n;
}

Assistant:

int simplerng_poisson_large(double lambda)
{
  /* "Rejection method PA" from "The Computer Generation of Poisson Random Variables" by A. C. Atkinson
     Journal of the Royal Statistical Society Series C (Applied Statistics) Vol. 28, No. 1. (1979)
     The article is on pages 29-35. The algorithm given here is on page 32. */
  static double beta, alpha, k;
  static double old_lambda = -999999.;

  if (lambda != old_lambda) {
    double c = 0.767 - 3.36/lambda;
    beta = PI/sqrt(3.0*lambda);
    alpha = beta*lambda;
    k = log(c) - lambda - log(beta);
    old_lambda = lambda;
  }

  for(;;) { /* forever */
    double u, x, v, y, temp, lhs, rhs;
    int n;

    u = simplerng_getuniform();
    x = (alpha - log((1.0 - u)/u))/beta;
    n = (int) floor(x + 0.5);
    if (n < 0) continue;

    v = simplerng_getuniform();
    y = alpha - beta*x;
    temp = 1.0 + exp(y);
    lhs = y + log(v/(temp*temp));
    rhs = k + n*log(lambda) - simplerng_logfactorial(n);
    if (lhs <= rhs) return n;
  }

}